

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O0

ElementMatcherPairs * __thiscall
testing::internal::MaxBipartiteMatchState::Compute
          (ElementMatcherPairs *__return_storage_ptr__,MaxBipartiteMatchState *this)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  reference pvVar4;
  ostream *poVar5;
  size_type sVar6;
  pair<unsigned_long,_unsigned_long> local_70;
  value_type local_60;
  size_t irhs;
  size_t ilhs_1;
  GTestLog local_48 [4];
  ulong local_38;
  size_t ilhs;
  vector<char,_std::allocator<char>_> seen;
  MaxBipartiteMatchState *this_local;
  ElementMatcherPairs *result;
  
  seen.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = this;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&ilhs);
  for (local_38 = 0; uVar1 = local_38, sVar3 = MatchMatrix::LhsSize(this->graph_), uVar1 < sVar3;
      local_38 = local_38 + 1) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->left_,local_38);
    bVar2 = IsTrue(*pvVar4 == 0xffffffffffffffff);
    if (!bVar2) {
      GTestLog::GTestLog(local_48,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googlemock/src/gmock-matchers.cc"
                         ,0x93);
      poVar5 = GTestLog::GetStream(local_48);
      poVar5 = std::operator<<(poVar5,"Condition left_[ilhs] == kUnused failed. ");
      poVar5 = std::operator<<(poVar5,"ilhs: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_38);
      poVar5 = std::operator<<(poVar5,", left_[ilhs]: ");
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->left_,local_38);
      std::ostream::operator<<(poVar5,*pvVar4);
      GTestLog::~GTestLog(local_48);
    }
    sVar3 = MatchMatrix::RhsSize(this->graph_);
    ilhs_1._7_1_ = 0;
    std::vector<char,_std::allocator<char>_>::assign
              ((vector<char,_std::allocator<char>_> *)&ilhs,sVar3,(value_type *)((long)&ilhs_1 + 7))
    ;
    TryAugment(this,local_38,(vector<char,_std::allocator<char>_> *)&ilhs);
  }
  ilhs_1._6_1_ = 0;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(__return_storage_ptr__);
  for (irhs = 0; sVar3 = irhs,
      sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->left_),
      sVar3 < sVar6; irhs = irhs + 1) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->left_,irhs);
    local_60 = *pvVar4;
    if (local_60 != 0xffffffffffffffff) {
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                (&local_70,&irhs,&local_60);
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::push_back(__return_storage_ptr__,&local_70);
    }
  }
  ilhs_1._6_1_ = 1;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&ilhs);
  return __return_storage_ptr__;
}

Assistant:

ElementMatcherPairs Compute() {
    // 'seen' is used for path finding { 0: unseen, 1: seen }.
    ::std::vector<char> seen;
    // Searches the residual flow graph for a path from each left node to
    // the sink in the residual flow graph, and if one is found, add flow
    // to the graph. It's okay to search through the left nodes once. The
    // edge from the implicit source node to each previously-visited left
    // node will have flow if that left node has any path to the sink
    // whatsoever. Subsequent augmentations can only add flow to the
    // network, and cannot take away that previous flow unit from the source.
    // Since the source-to-left edge can only carry one flow unit (or,
    // each element can be matched to only one matcher), there is no need
    // to visit the left nodes more than once looking for augmented paths.
    // The flow is known to be possible or impossible by looking at the
    // node once.
    for (size_t ilhs = 0; ilhs < graph_->LhsSize(); ++ilhs) {
      // Reset the path-marking vector and try to find a path from
      // source to sink starting at the left_[ilhs] node.
      GTEST_CHECK_(left_[ilhs] == kUnused)
          << "ilhs: " << ilhs << ", left_[ilhs]: " << left_[ilhs];
      // 'seen' initialized to 'graph_->RhsSize()' copies of 0.
      seen.assign(graph_->RhsSize(), 0);
      TryAugment(ilhs, &seen);
    }
    ElementMatcherPairs result;
    for (size_t ilhs = 0; ilhs < left_.size(); ++ilhs) {
      size_t irhs = left_[ilhs];
      if (irhs == kUnused) continue;
      result.push_back(ElementMatcherPair(ilhs, irhs));
    }
    return result;
  }